

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool httplib::detail::is_hex(char c,int *v)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = (int)c;
  uVar2 = iVar1 - 0x30;
  if (c < ' ' || 9 < uVar2) {
    if ((byte)(c + 0xbfU) < 6) {
      uVar2 = iVar1 - 0x37;
    }
    else {
      if (5 < (byte)(c + 0x9fU)) {
        return false;
      }
      uVar2 = iVar1 - 0x57;
    }
  }
  *v = uVar2;
  return true;
}

Assistant:

inline bool is_hex(char c, int &v) {
  if (0x20 <= c && isdigit(c)) {
    v = c - '0';
    return true;
  } else if ('A' <= c && c <= 'F') {
    v = c - 'A' + 10;
    return true;
  } else if ('a' <= c && c <= 'f') {
    v = c - 'a' + 10;
    return true;
  }
  return false;
}